

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::~IfcSlabType(IfcSlabType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x975fc0;
  *(undefined8 *)&this->field_0x1c0 = 0x9760d8;
  *(undefined8 *)&this->field_0x88 = 0x975fe8;
  *(undefined8 *)&this->field_0x98 = 0x976010;
  *(undefined8 *)&this->field_0xf0 = 0x976038;
  *(undefined8 *)&this->field_0x148 = 0x976060;
  *(undefined8 *)&this->field_0x180 = 0x976088;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x9760b0;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x9763a0;
  *(undefined8 *)&this->field_0x1c0 = 0x976468;
  *(undefined8 *)&this->field_0x88 = 0x9763c8;
  *(undefined8 *)&this->field_0x98 = 0x9763f0;
  *(undefined8 *)&this->field_0xf0 = 0x976418;
  *(undefined8 *)&this->field_0x148 = 0x976440;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__00976100);
  operator_delete(this);
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}